

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsplit.hpp
# Opt level: O1

void __thiscall
ncursespp::
vsplit<ncursespp::constraint::fixed_impl<20,ncursespp::hsplit<ncursespp::constraint::fixed_impl<15,ncursespp::item_list<empty_item>>,ncursespp::constraint::fill_impl<ncursespp::color_rect>>>,ncursespp::constraint::fixed_impl<1,ncursespp::color_rect>,ncursespp::constraint::fill_impl<ncursespp::text>>
::resize_impl<0ul,1ul,2ul>
          (vsplit<ncursespp::constraint::fixed_impl<20,ncursespp::hsplit<ncursespp::constraint::fixed_impl<15,ncursespp::item_list<empty_item>>,ncursespp::constraint::fill_impl<ncursespp::color_rect>>>,ncursespp::constraint::fixed_impl<1,ncursespp::color_rect>,ncursespp::constraint::fill_impl<ncursespp::text>>
           *this,ulong param_2,ulong param_3)

{
  color_rect *this_00;
  text *this_01;
  uint uVar1;
  point<int> pVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  rect_i r;
  rect_i r_00;
  uint local_3c;
  
  uVar1 = (int)param_3 - (int)param_2;
  param_2 = param_2 & 0xffffffff00000000;
  param_3 = param_3 & 0xffffffff00000000;
  iVar5 = uVar1 - 0x14;
  if ((int)uVar1 < 0x15) {
    iVar5 = 0;
  }
  uVar4 = 0x14;
  if ((int)uVar1 < 0x14) {
    uVar4 = uVar1;
  }
  uVar6 = iVar5 - 1;
  if (iVar5 < 2) {
    uVar6 = 0;
  }
  iVar3 = 1;
  if (iVar5 < 1) {
    iVar3 = iVar5;
  }
  if (uVar1 == 0xffffffff && 0 < (int)uVar6) {
    uVar4 = uVar6;
    uVar1 = uVar6;
    uVar6 = 0;
LAB_00102aae:
    hsplit<ncursespp::constraint::fixed_impl<15,ncursespp::item_list<empty_item>>,ncursespp::constraint::fill_impl<ncursespp::color_rect>>
    ::resize_impl<0ul,1ul>
              (*(hsplit<ncursespp::constraint::fixed_impl<15,ncursespp::item_list<empty_item>>,ncursespp::constraint::fill_impl<ncursespp::color_rect>>
                 **)(this + 0x10),param_2,uVar1 | param_3);
  }
  else {
    if (0 < (int)uVar1) {
      uVar1 = uVar4 - 1;
      goto LAB_00102aae;
    }
    uVar4 = 0;
  }
  if ((int)uVar6 < 1 || iVar5 != -1) {
    if (iVar5 < 1) goto LAB_00102b2d;
    local_3c = uVar4 + iVar3;
    uVar1 = (uVar4 + iVar3) - 1;
  }
  else {
    uVar1 = uVar6 + uVar4;
    uVar6 = 0;
    local_3c = uVar1;
  }
  this_00 = *(color_rect **)(this + 8);
  r.right_bottom = (point<int>)(uVar1 | param_3);
  r.left_top = (point<int>)(uVar4 | param_2);
  color_rect::redraw(this_00,r);
  (this_00->super_widget<ncursespp::color_rect>).size_.left_top = (point<int>)(uVar4 | param_2);
  (this_00->super_widget<ncursespp::color_rect>).size_.right_bottom = (point<int>)(uVar1 | param_3);
  uVar4 = local_3c;
LAB_00102b2d:
  if (0 < (int)uVar6) {
    pVar2 = (point<int>)(param_3 | uVar6 + uVar4);
    this_01 = *(text **)this;
    r_00.right_bottom = pVar2;
    r_00.left_top = (point<int>)(param_2 | uVar4);
    text::do_resize(this_01,r_00);
    (this_01->super_widget<ncursespp::text>).size_.left_top = (point<int>)(param_2 | uVar4);
    (this_01->super_widget<ncursespp::text>).size_.right_bottom = pVar2;
  }
  return;
}

Assistant:

void resize_impl(rect_i size, std::index_sequence<I...>)
    {
        std::array<int, count> widths {};
        int idx = 0;
        auto space = size.width();

        // query size_calculator<>::calc for every constraint_t in Splits
        // calc will decrement space when the size is known
        auto apply_calc = [&](auto& S) {
            using SplitType = std::decay_t<decltype(S)>;
            widths[idx] = SplitType::calc(space);
            idx ++;
        };

        (apply_calc(std::get<I>(splits)), ...);

        idx = 0;
        int xpos = 0;
        auto apply_resize = [&](auto& S) {
            if (widths[idx] == -1 && space > 0) {
                auto r = rect_i{{xpos, size.left_top.y}, {xpos + space, size.right_bottom.y}};
                xpos += space;
                space = 0;
                S.resize(r);
            } else if (widths[idx] > 0) {
                auto r = rect_i{{xpos, size.left_top.y}, {xpos + widths[idx] - 1, size.right_bottom.y}};
                xpos += widths[idx];
                S.resize(r);
            }

            idx ++;
        };

        (apply_resize(std::get<I>(splits)), ...);
    }